

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall
IR::BranchInstr::ReplaceTarget
          (BranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  RealCount *pRVar1;
  LabelInstr *pLVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  MultiBranchInstr *this_00;
  Type pSVar6;
  char *message;
  char *error;
  uint lineNumber;
  
  pLVar2 = this->m_branchTarget;
  if (pLVar2 == (LabelInstr *)0x0) {
    if (this->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_004bda3f;
    }
  }
  else if (this->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
LAB_004bda3f:
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,lineNumber,error,message);
    if (!bVar4) goto LAB_004bdb36;
    *puVar5 = 0;
  }
  if (pLVar2 == (LabelInstr *)0x0) {
    this_00 = AsMultiBrInstr(this);
    bVar4 = MultiBranchInstr::ReplaceTarget(this_00,oldLabelInstr,newLabelInstr);
    return bVar4;
  }
  if (this->m_branchTarget == oldLabelInstr) {
    if (this->m_isMultiBranch == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
      if (!bVar4) {
LAB_004bdb36:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    if (this->m_branchTarget != (LabelInstr *)0x0) {
      LabelInstr::RemoveLabelRef(this->m_branchTarget,this);
    }
    if (newLabelInstr != (LabelInstr *)0x0) {
      pSVar6 = (Type)new<Memory::ArenaAllocator>
                               (0x10,(newLabelInstr->labelRefs).
                                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                     .allocator,0x366bee);
      pSVar6[1].next = (Type)this;
      pSVar6->next = (newLabelInstr->labelRefs).
                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (newLabelInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar6;
      pRVar1 = &(newLabelInstr->labelRefs).
                super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
    this->m_branchTarget = newLabelInstr;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
BranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    if (this->IsMultiBranch())
    {
        return this->AsMultiBrInstr()->ReplaceTarget(oldLabelInstr, newLabelInstr);
    }
    if (this->GetTarget() == oldLabelInstr)
    {
        this->SetTarget(newLabelInstr);
        return true;
    }
    return false;
}